

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

uint8 * __thiscall
caffe::InputParameter::InternalSerializeWithCachedSizesToArray
          (InputParameter *this,bool deterministic,uint8 *target)

{
  int iVar1;
  Type *value;
  UnknownFieldSet *unknown_fields;
  uint8 *puVar2;
  int index;
  
  iVar1 = (this->shape_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::BlobShape>::TypeHandler>
                      (&(this->shape_).super_RepeatedPtrFieldBase,index);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessageNoVirtualToArray<caffe::BlobShape>(1,value,deterministic,target);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return target;
  }
  unknown_fields = InputParameter::unknown_fields(this);
  puVar2 = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray
                     (unknown_fields,target);
  return puVar2;
}

Assistant:

::google::protobuf::uint8* InputParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.InputParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .caffe.BlobShape shape = 1;
  for (unsigned int i = 0, n = this->shape_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1, this->shape(i), deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.InputParameter)
  return target;
}